

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubstitutionTree.hpp
# Opt level: O0

void __thiscall
Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::FastInstancesIterator::
FastInstancesIterator<Kernel::Literal*>
          (FastInstancesIterator *this,
          SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs> *parent,Node *root,
          Literal *query,bool retrieveSubstitution,bool reversed)

{
  undefined8 in_RDX;
  Literal *in_RSI;
  SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs> *in_RDI;
  undefined4 in_R8D;
  Renaming *in_stack_ffffffffffffff70;
  size_t in_stack_ffffffffffffff78;
  SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs> *initialCapacity;
  Stack<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::NodeAlgorithm>
  *this_00;
  undefined4 in_stack_ffffffffffffff90;
  undefined2 uVar1;
  Node *root_00;
  FastInstancesIterator *this_01;
  
  uVar1 = (undefined2)((ulong)in_RDX >> 0x30);
  root_00 = (Node *)&in_RDI->_root;
  Lib::VirtualIterator<Inferences::ALASCA::BinaryResolutionConf::Rhs_*>::VirtualIterator
            ((VirtualIterator<Inferences::ALASCA::BinaryResolutionConf::Rhs_*> *)root_00);
  this_01 = (FastInstancesIterator *)&in_RDI->field_0x10;
  SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::InstMatcher::InstMatcher
            ((InstMatcher *)CONCAT44(in_R8D,in_stack_ffffffffffffff90));
  Kernel::Renaming::Renaming(in_stack_ffffffffffffff70);
  this_00 = (Stack<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::NodeAlgorithm>
             *)&in_RDI[7].field_0x10;
  Lib::Stack<void_*>::Stack((Stack<void_*> *)this_00,in_stack_ffffffffffffff78);
  initialCapacity = in_RDI + 9;
  Lib::Stack<unsigned_int>::Stack((Stack<unsigned_int> *)this_00,(size_t)initialCapacity);
  Lib::
  Stack<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::NodeAlgorithm>::
  Stack(this_00,(size_t)initialCapacity);
  InstanceCntr::InstanceCntr((InstanceCntr *)&in_RDI[0xb].field_0x10);
  init<Kernel::Literal*>(this_01,in_RDI,root_00,in_RSI,SUB21((ushort)uVar1 >> 8,0),SUB21(uVar1,0));
  return;
}

Assistant:

FastInstancesIterator(SubstitutionTree* parent, Node* root, TermOrLit query, bool retrieveSubstitution, bool reversed)
      { init(parent,root,query,retrieveSubstitution,reversed); }